

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OS.cpp
# Opt level: O2

void __thiscall slang::OS::writeFile(OS *this,path *path,string_view contents)

{
  bool bVar1;
  ofstream file;
  
  std::filesystem::__cxx11::path::path<char[2],std::filesystem::__cxx11::path>
            ((path *)&file,(char (*) [2])0x4c908c,auto_format);
  bVar1 = std::filesystem::__cxx11::operator==((path *)this,(path *)&file);
  std::filesystem::__cxx11::path::~path((path *)&file);
  if (bVar1) {
    std::ostream::write((char *)&std::cout,contents._M_len);
    std::ostream::flush();
  }
  else {
    std::ofstream::ofstream<std::filesystem::__cxx11::path,std::filesystem::__cxx11::path>
              ((ofstream *)&file,(path *)this,_S_out);
    std::ios::exceptions((int)&file + (int)*(undefined8 *)(_file + -0x18));
    std::ostream::write((char *)&file,contents._M_len);
    std::ostream::flush();
    std::ofstream::~ofstream(&file);
  }
  return;
}

Assistant:

void OS::writeFile(const fs::path& path, std::string_view contents) {
    if (path == "-") {
        std::cout.write(contents.data(), (std::streamsize)contents.size());
        std::cout.flush();
    }
    else {
        std::ofstream file(path);
        file.exceptions(std::ios::failbit | std::ios::badbit);
        file.write(contents.data(), (std::streamsize)contents.size());
        file.flush();
    }
}